

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O1

HRESULT __thiscall
ChakraCoreHostScriptContext::InitializeImportMeta
          (ChakraCoreHostScriptContext *this,ModuleRecordBase *referencingModule,
          Var importMetaObject)

{
  JsErrorCode JVar1;
  HRESULT HVar2;
  AutoFilterExceptionRegion local_24 [2];
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  
  if (this->initializeImportMetaCallback == (InitializeImportMetaCallback)0x0) {
    HVar2 = -0x7ff8ffa9;
  }
  else {
    AutoFilterExceptionRegion::AutoFilterExceptionRegion(local_24,ExceptionType_All);
    JVar1 = (*this->initializeImportMetaCallback)(referencingModule,importMetaObject);
    AutoFilterExceptionRegion::~AutoFilterExceptionRegion(local_24);
    HVar2 = -0x7ff8ffa9;
    if (JVar1 == JsNoError) {
      HVar2 = 0;
    }
  }
  return HVar2;
}

Assistant:

HRESULT ChakraCoreHostScriptContext::InitializeImportMeta(Js::ModuleRecordBase* referencingModule, Js::Var importMetaObject)
{
    if (initializeImportMetaCallback == nullptr)
    {
        return E_INVALIDARG;
    }
    {
        AUTO_NO_EXCEPTION_REGION;
        JsErrorCode errorCode = initializeImportMetaCallback(referencingModule, importMetaObject);
        if (errorCode == JsNoError)
        {
            return NOERROR;
        }
    }
    return E_INVALIDARG;
}